

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundAnalysisPreprocessing.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::CoreMLModels::SoundAnalysisPreprocessing::SerializeWithCachedSizes
          (SoundAnalysisPreprocessing *this,CodedOutputStream *output)

{
  bool bVar1;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  SoundAnalysisPreprocessing *this_local;
  
  bVar1 = has_vggish(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x14,&((this->SoundAnalysisPreprocessingType_).vggish_)->super_MessageLite,output);
  }
  return;
}

Assistant:

void SoundAnalysisPreprocessing::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.CoreMLModels.SoundAnalysisPreprocessing)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.CoreMLModels.SoundAnalysisPreprocessing.Vggish vggish = 20;
  if (has_vggish()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      20, *SoundAnalysisPreprocessingType_.vggish_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.CoreMLModels.SoundAnalysisPreprocessing)
}